

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiOutAlsa::sendMessage(MidiOutAlsa *this,uchar *message,size_t size)

{
  void *pvVar1;
  string *psVar2;
  string *this_00;
  string local_e8;
  string local_c8;
  uint local_a8;
  undefined1 local_a4 [3];
  undefined1 local_a1;
  uint i;
  snd_seq_event_t ev;
  string local_58;
  uint local_34;
  undefined8 *puStack_30;
  uint nBytes;
  AlsaMidiData *data;
  size_t sStack_20;
  int result;
  size_t size_local;
  uchar *message_local;
  MidiOutAlsa *this_local;
  
  puStack_30 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  local_34 = (uint)size;
  sStack_20 = size;
  size_local = (size_t)message;
  message_local = (uchar *)this;
  if (*(uint *)(puStack_30 + 4) < local_34) {
    *(uint *)(puStack_30 + 4) = local_34;
    data._4_4_ = snd_midi_event_resize_buffer(puStack_30[3]);
    if (data._4_4_ != 0) {
      psVar2 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)psVar2,"MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer."
                );
      std::__cxx11::string::string((string *)&local_58,(string *)psVar2);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      return;
    }
    free((void *)puStack_30[5]);
    pvVar1 = malloc((ulong)*(uint *)(puStack_30 + 4));
    puStack_30[5] = pvVar1;
    if (puStack_30[5] == 0) {
      this_00 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)this_00,"MidiOutAlsa::initialize: error allocating buffer memory!\n\n");
      psVar2 = (string *)(ev.data.raw8.d + 4);
      std::__cxx11::string::string((string *)psVar2,(string *)this_00);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,psVar2);
      std::__cxx11::string::~string((string *)(ev.data.raw8.d + 4));
      return;
    }
  }
  memset(local_a4,0,0x1c);
  ev.time.tick._1_1_ = (undefined1)*(undefined4 *)((long)puStack_30 + 0xc);
  ev.time.tick._2_1_ = 0xfe;
  ev.time.tick._3_1_ = 0xfd;
  local_a1 = 0xfd;
  for (local_a8 = 0; local_a8 < local_34; local_a8 = local_a8 + 1) {
    *(undefined1 *)(puStack_30[5] + (ulong)local_a8) = *(undefined1 *)(size_local + local_a8);
  }
  data._4_4_ = snd_midi_event_encode(puStack_30[3],puStack_30[5],local_34,local_a4);
  if (data._4_4_ < (int)local_34) {
    psVar2 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
    std::__cxx11::string::operator=
              ((string *)psVar2,"MidiOutAlsa::sendMessage: event parsing error!");
    std::__cxx11::string::string((string *)&local_c8,(string *)psVar2);
    MidiApi::error((MidiApi *)this,WARNING,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    data._4_4_ = snd_seq_event_output(*puStack_30,local_a4);
    if (data._4_4_ < 0) {
      psVar2 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)psVar2,"MidiOutAlsa::sendMessage: error sending MIDI message to port.");
      std::__cxx11::string::string((string *)&local_e8,(string *)psVar2);
      MidiApi::error((MidiApi *)this,WARNING,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      snd_seq_drain_output(*puStack_30);
    }
  }
  return;
}

Assistant:

void MidiOutAlsa :: sendMessage( const unsigned char *message, size_t size )
{
  int result;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  unsigned int nBytes = static_cast<unsigned int> (size);
  if ( nBytes > data->bufferSize ) {
    data->bufferSize = nBytes;
    result = snd_midi_event_resize_buffer( data->coder, nBytes );
    if ( result != 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    free (data->buffer);
    data->buffer = (unsigned char *) malloc( data->bufferSize );
    if ( data->buffer == NULL ) {
      errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
      error( RtMidiError::MEMORY_ERROR, errorString_ );
      return;
    }
  }

  snd_seq_event_t ev;
  snd_seq_ev_clear( &ev );
  snd_seq_ev_set_source( &ev, data->vport );
  snd_seq_ev_set_subs( &ev );
  snd_seq_ev_set_direct( &ev );
  for ( unsigned int i=0; i<nBytes; ++i ) data->buffer[i] = message[i];
  result = snd_midi_event_encode( data->coder, data->buffer, (long)nBytes, &ev );
  if ( result < (int)nBytes ) {
    errorString_ = "MidiOutAlsa::sendMessage: event parsing error!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  // Send the event.
  result = snd_seq_event_output( data->seq, &ev );
  if ( result < 0 ) {
    errorString_ = "MidiOutAlsa::sendMessage: error sending MIDI message to port.";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }
  snd_seq_drain_output( data->seq );
}